

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

errr finish_parse_class(parser *p)

{
  player_class *ppVar1;
  uint uVar2;
  player_class *ppVar3;
  
  ppVar1 = (player_class *)parser_priv(p);
  classes = ppVar1;
  if (ppVar1 != (player_class *)0x0) {
    uVar2 = 0xffffffff;
    ppVar3 = ppVar1;
    do {
      ppVar3 = ppVar3->next;
      uVar2 = uVar2 + 1;
    } while (ppVar3 != (player_class *)0x0);
    for (; ppVar1 != (player_class *)0x0; ppVar1 = ppVar1->next) {
      if (uVar2 == 0xffffffff) {
        __assert_fail("num",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/init.c"
                      ,0x10e8,"errr finish_parse_class(struct parser *)");
      }
      ppVar1->cidx = uVar2;
      uVar2 = uVar2 - 1;
    }
  }
  parser_destroy(p);
  return 0;
}

Assistant:

static errr finish_parse_class(struct parser *p) {
	struct player_class *c;
	int num = 0;
	classes = parser_priv(p);
	for (c = classes; c; c = c->next) num++;
	for (c = classes; c; c = c->next, num--) {
		assert(num);
		c->cidx = num - 1;
	}
	parser_destroy(p);
	return 0;
}